

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::TextureSpecCase::readPixels
          (TextureSpecCase *this,Surface *dst,int x,int y,int width,int height)

{
  void *data;
  TextureFormat local_60;
  PixelBufferAccess local_58;
  
  tcu::Surface::setSize(dst,width,height);
  local_60.order = RGBA;
  local_60.type = UNORM_INT8;
  data = (void *)(dst->m_pixels).m_cap;
  if (data != (void *)0x0) {
    data = (dst->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess(&local_58,&local_60,dst->m_width,dst->m_height,1,data);
  sglr::ContextWrapper::glReadPixels
            (&this->super_ContextWrapper,x,y,width,height,0x1908,0x1401,
             local_58.super_ConstPixelBufferAccess.m_data);
  return;
}

Assistant:

void TextureSpecCase::readPixels (tcu::Surface& dst, int x, int y, int width, int height)
{
	dst.setSize(width, height);
	glReadPixels(x, y, width, height, GL_RGBA, GL_UNSIGNED_BYTE, dst.getAccess().getDataPtr());
}